

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image_function.cpp
# Opt level: O1

void Image_Function::Resize
               (Image *in,uint32_t startXIn,uint32_t startYIn,uint32_t widthIn,uint32_t heightIn,
               Image *out,uint32_t startXOut,uint32_t startYOut,uint32_t widthOut,uint32_t heightOut
               )

{
  uint uVar1;
  undefined1 auVar2 [16];
  int iVar3;
  undefined4 in_register_00000014;
  EVP_PKEY_CTX *src;
  uchar *puVar4;
  ulong uVar5;
  long lVar6;
  uchar *puVar7;
  ulong __n;
  undefined1 auVar8 [64];
  undefined1 auVar9 [64];
  undefined1 auVar10 [64];
  undefined1 auVar11 [64];
  undefined1 auVar12 [64];
  undefined1 auVar13 [64];
  undefined1 auVar14 [64];
  undefined1 auVar15 [64];
  undefined1 auVar16 [64];
  undefined1 auVar17 [64];
  undefined1 auVar18 [64];
  undefined1 auVar19 [64];
  undefined1 auVar20 [64];
  undefined1 auVar21 [64];
  undefined1 auVar22 [64];
  undefined1 auVar23 [64];
  undefined1 auVar24 [64];
  undefined1 auVar25 [64];
  undefined1 auVar26 [64];
  undefined1 in_ZMM7 [64];
  vector<unsigned_int,_std::allocator<unsigned_int>_> positionX;
  allocator_type local_89;
  uchar *local_88;
  uint32_t local_7c;
  uint32_t local_78;
  uint32_t local_74;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_70;
  ImageTemplate<unsigned_char> local_58;
  
  local_88 = (uchar *)CONCAT44(in_register_00000014,startYIn);
  local_7c = widthIn;
  local_78 = startXIn;
  ParameterValidation<PenguinV_Image::ImageTemplate<unsigned_char>>
            (in,startXIn,startYIn,widthIn,heightIn);
  ParameterValidation<PenguinV_Image::ImageTemplate<unsigned_char>>
            (out,startXOut,startYOut,widthOut,heightOut);
  local_58._vptr_ImageTemplate = (_func_int **)&PTR__ImageTemplate_00201be8;
  local_58._data = (uchar *)0x0;
  local_58._type = out->_type;
  PenguinV_Image::ImageTemplate<unsigned_char>::copy(&local_58,(EVP_PKEY_CTX *)out,src);
  VerifyGrayScaleImage<PenguinV_Image::ImageTemplate<unsigned_char>>(in);
  VerifyGrayScaleImage<PenguinV_Image::ImageTemplate<unsigned_char>>(&local_58);
  local_58._vptr_ImageTemplate = (_func_int **)&PTR__ImageTemplate_00201be8;
  PenguinV_Image::ImageTemplate<unsigned_char>::clear(&local_58);
  local_74 = in->_rowSize;
  uVar1 = out->_rowSize;
  local_88 = in->_data + (int)local_88 * local_74;
  puVar7 = out->_data;
  __n = (ulong)widthOut;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&local_70,__n,&local_89);
  if (widthOut != 0) {
    auVar8 = vpbroadcastq_avx512f();
    auVar9 = vpbroadcastd_avx512f();
    auVar10 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
    auVar11 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
    auVar12 = vpmovsxbd_avx512f(_DAT_001dd2f8);
    lVar6 = 0;
    auVar13 = vpbroadcastq_avx512f(ZEXT816(0x10));
    auVar14 = vpbroadcastd_avx512f(ZEXT416(0x10));
    do {
      uVar5 = vpcmpuq_avx512f(auVar11,auVar8,2);
      auVar15 = vpmulld_avx512f(auVar12,auVar9);
      if ((uVar5 & 1) != 0) {
        in_ZMM7 = ZEXT464(auVar15._0_4_ / widthOut);
      }
      if ((uVar5 & 2) != 0) {
        auVar2 = vpinsrd_avx(in_ZMM7._0_16_,auVar15._4_4_ / widthOut,1);
        in_ZMM7 = vinserti32x4_avx512f(in_ZMM7,auVar2,0);
      }
      if ((uVar5 & 4) != 0) {
        auVar2 = vpinsrd_avx(in_ZMM7._0_16_,auVar15._8_4_ / widthOut,2);
        in_ZMM7 = vinserti32x4_avx512f(in_ZMM7,auVar2,0);
      }
      if ((uVar5 & 8) != 0) {
        auVar2 = vpinsrd_avx(in_ZMM7._0_16_,auVar15._12_4_ / widthOut,3);
        in_ZMM7 = vinserti32x4_avx512f(in_ZMM7,auVar2,0);
      }
      auVar18 = in_ZMM7;
      if ((uVar5 & 0x10) != 0) {
        auVar16 = vpbroadcastd_avx512f();
        auVar18._0_16_ = in_ZMM7._0_16_;
        auVar18._16_4_ = auVar16._16_4_;
        auVar18._20_4_ = in_ZMM7._20_4_;
        auVar18._24_4_ = in_ZMM7._24_4_;
        auVar18._28_4_ = in_ZMM7._28_4_;
        auVar18._32_4_ = in_ZMM7._32_4_;
        auVar18._36_4_ = in_ZMM7._36_4_;
        auVar18._40_4_ = in_ZMM7._40_4_;
        auVar18._44_4_ = in_ZMM7._44_4_;
        auVar18._48_4_ = in_ZMM7._48_4_;
        auVar18._52_4_ = in_ZMM7._52_4_;
        auVar18._56_4_ = in_ZMM7._56_4_;
        auVar18._60_4_ = in_ZMM7._60_4_;
      }
      auVar16 = auVar18;
      if ((uVar5 & 0x20) != 0) {
        auVar17 = vpbroadcastd_avx512f();
        auVar16._0_20_ = auVar18._0_20_;
        auVar16._20_4_ = auVar17._20_4_;
        auVar16._24_4_ = auVar18._24_4_;
        auVar16._28_4_ = auVar18._28_4_;
        auVar16._32_4_ = auVar18._32_4_;
        auVar16._36_4_ = auVar18._36_4_;
        auVar16._40_4_ = auVar18._40_4_;
        auVar16._44_4_ = auVar18._44_4_;
        auVar16._48_4_ = auVar18._48_4_;
        auVar16._52_4_ = auVar18._52_4_;
        auVar16._56_4_ = auVar18._56_4_;
        auVar16._60_4_ = auVar18._60_4_;
      }
      auVar17 = auVar16;
      if ((uVar5 & 0x40) != 0) {
        auVar18 = vpbroadcastd_avx512f();
        auVar17._0_24_ = auVar16._0_24_;
        auVar17._24_4_ = auVar18._24_4_;
        auVar17._28_4_ = auVar16._28_4_;
        auVar17._32_4_ = auVar16._32_4_;
        auVar17._36_4_ = auVar16._36_4_;
        auVar17._40_4_ = auVar16._40_4_;
        auVar17._44_4_ = auVar16._44_4_;
        auVar17._48_4_ = auVar16._48_4_;
        auVar17._52_4_ = auVar16._52_4_;
        auVar17._56_4_ = auVar16._56_4_;
        auVar17._60_4_ = auVar16._60_4_;
      }
      auVar19 = auVar17;
      if ((uVar5 & 0x80) != 0) {
        auVar18 = vpbroadcastd_avx512f();
        auVar19._0_28_ = auVar17._0_28_;
        auVar19._28_4_ = auVar18._28_4_;
        auVar19._32_4_ = auVar17._32_4_;
        auVar19._36_4_ = auVar17._36_4_;
        auVar19._40_4_ = auVar17._40_4_;
        auVar19._44_4_ = auVar17._44_4_;
        auVar19._48_4_ = auVar17._48_4_;
        auVar19._52_4_ = auVar17._52_4_;
        auVar19._56_4_ = auVar17._56_4_;
        auVar19._60_4_ = auVar17._60_4_;
      }
      uVar5 = vpcmpuq_avx512f(auVar10,auVar8,2);
      auVar20 = auVar19;
      if ((uVar5 & 1) != 0) {
        vextracti32x4_avx512f(auVar15,2);
        auVar18 = vpbroadcastd_avx512f();
        auVar20._0_32_ = auVar19._0_32_;
        auVar20._32_4_ = auVar18._32_4_;
        auVar20._36_4_ = auVar19._36_4_;
        auVar20._40_4_ = auVar19._40_4_;
        auVar20._44_4_ = auVar19._44_4_;
        auVar20._48_4_ = auVar19._48_4_;
        auVar20._52_4_ = auVar19._52_4_;
        auVar20._56_4_ = auVar19._56_4_;
        auVar20._60_4_ = auVar19._60_4_;
      }
      auVar21 = auVar20;
      if ((uVar5 & 2) != 0) {
        vextracti32x4_avx512f(auVar15,2);
        auVar18 = vpbroadcastd_avx512f();
        auVar21._0_36_ = auVar20._0_36_;
        auVar21._36_4_ = auVar18._36_4_;
        auVar21._40_4_ = auVar20._40_4_;
        auVar21._44_4_ = auVar20._44_4_;
        auVar21._48_4_ = auVar20._48_4_;
        auVar21._52_4_ = auVar20._52_4_;
        auVar21._56_4_ = auVar20._56_4_;
        auVar21._60_4_ = auVar20._60_4_;
      }
      auVar22 = auVar21;
      if ((uVar5 & 4) != 0) {
        vextracti32x4_avx512f(auVar15,2);
        auVar18 = vpbroadcastd_avx512f();
        auVar22._0_40_ = auVar21._0_40_;
        auVar22._40_4_ = auVar18._40_4_;
        auVar22._44_4_ = auVar21._44_4_;
        auVar22._48_4_ = auVar21._48_4_;
        auVar22._52_4_ = auVar21._52_4_;
        auVar22._56_4_ = auVar21._56_4_;
        auVar22._60_4_ = auVar21._60_4_;
      }
      auVar23 = auVar22;
      if ((uVar5 & 8) != 0) {
        vextracti32x4_avx512f(auVar15,2);
        auVar18 = vpbroadcastd_avx512f();
        auVar23._0_44_ = auVar22._0_44_;
        auVar23._44_4_ = auVar18._44_4_;
        auVar23._48_4_ = auVar22._48_4_;
        auVar23._52_4_ = auVar22._52_4_;
        auVar23._56_4_ = auVar22._56_4_;
        auVar23._60_4_ = auVar22._60_4_;
      }
      auVar24 = auVar23;
      if ((uVar5 & 0x10) != 0) {
        vextracti32x4_avx512f(auVar15,3);
        auVar18 = vpbroadcastd_avx512f();
        auVar24._0_48_ = auVar23._0_48_;
        auVar24._48_4_ = auVar18._48_4_;
        auVar24._52_4_ = auVar23._52_4_;
        auVar24._56_4_ = auVar23._56_4_;
        auVar24._60_4_ = auVar23._60_4_;
      }
      auVar25 = auVar24;
      if ((uVar5 & 0x20) != 0) {
        vextracti32x4_avx512f(auVar15,3);
        auVar18 = vpbroadcastd_avx512f();
        auVar25._0_52_ = auVar24._0_52_;
        auVar25._52_4_ = auVar18._52_4_;
        auVar25._56_4_ = auVar24._56_4_;
        auVar25._60_4_ = auVar24._60_4_;
      }
      auVar26 = auVar25;
      if ((uVar5 & 0x40) != 0) {
        vextracti32x4_avx512f(auVar15,3);
        auVar18 = vpbroadcastd_avx512f();
        auVar26._0_56_ = auVar25._0_56_;
        auVar26._56_4_ = auVar18._56_4_;
        auVar26._60_4_ = auVar25._60_4_;
      }
      in_ZMM7 = auVar26;
      if ((uVar5 & 0x80) != 0) {
        vextracti32x4_avx512f(auVar15,3);
        auVar15 = vpbroadcastd_avx512f();
        in_ZMM7._60_4_ = auVar15._60_4_;
        in_ZMM7._0_60_ = auVar26._0_60_;
      }
      auVar15 = vmovdqu32_avx512f(in_ZMM7);
      *(undefined1 (*) [64])
       ((long)local_70.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_start + lVar6) = auVar15;
      auVar11 = vpaddq_avx512f(auVar11,auVar13);
      auVar10 = vpaddq_avx512f(auVar10,auVar13);
      auVar12 = vpaddd_avx512f(auVar12,auVar14);
      lVar6 = lVar6 + 0x40;
    } while ((__n + 0xf >> 4) * 0x40 != lVar6);
  }
  if (uVar1 * heightOut != 0) {
    puVar7 = puVar7 + (ulong)startXOut + (ulong)(startYOut * uVar1);
    puVar4 = puVar7 + uVar1 * heightOut;
    iVar3 = 0;
    do {
      if (widthOut != 0) {
        uVar5 = 0;
        do {
          puVar7[uVar5] =
               local_88[(ulong)local_70.
                               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                               _M_impl.super__Vector_impl_data._M_start[uVar5] +
                        (ulong)(((iVar3 * heightIn) / heightOut) * local_74) + (ulong)local_78];
          uVar5 = uVar5 + 1;
        } while (__n != uVar5);
      }
      puVar7 = puVar7 + uVar1;
      iVar3 = iVar3 + 1;
    } while (puVar7 != puVar4);
  }
  if (local_70.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_70.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                    .super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void Resize( const Image & in, uint32_t startXIn, uint32_t startYIn, uint32_t widthIn, uint32_t heightIn,
                 Image & out, uint32_t startXOut, uint32_t startYOut, uint32_t widthOut, uint32_t heightOut )
    {
        ParameterValidation( in, startXIn, startYIn, widthIn, heightIn );
        ParameterValidation( out, startXOut, startYOut, widthOut, heightOut );
        VerifyGrayScaleImage( in, out );

        const uint32_t rowSizeIn  = in.rowSize();
        const uint32_t rowSizeOut = out.rowSize();

        const uint8_t * inY  = in.data()  + startYIn  * rowSizeIn  + startXIn;
        uint8_t       * outY = out.data() + startYOut * rowSizeOut + startXOut;

        const uint8_t * outYEnd = outY + heightOut * rowSizeOut;

        uint32_t idY = 0;

        // Precalculation of X position
        std::vector < uint32_t > positionX( widthOut );
        for( uint32_t x = 0; x < widthOut; ++x )
            positionX[x] = x * widthIn / widthOut;

        for( ; outY != outYEnd; outY += rowSizeOut, ++idY ) {
            const uint8_t * inX  = inY + (idY * heightIn / heightOut) * rowSizeIn;
            uint8_t       * outX = outY;

            const uint8_t * outXEnd = outX + widthOut;

            const uint32_t * idX = positionX.data();

            for( ; outX != outXEnd; ++outX, ++idX )
                (*outX) = *(inX + (*idX));
        }
    }